

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O3

real __thiscall fasttext::Matrix::l2NormRow(Matrix *this,int64_t i)

{
  float fVar1;
  long lVar2;
  runtime_error *this_00;
  long lVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  
  lVar2 = this->n_;
  auVar5 = ZEXT816(0) << 0x40;
  auVar6 = ZEXT1664(auVar5);
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      fVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[i * lVar2 + lVar3];
      dVar4 = auVar6._0_8_ + (double)(fVar1 * fVar1);
      auVar6 = ZEXT864((ulong)dVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dVar4;
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
    if (NAN(dVar4)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Encountered NaN.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (auVar5._0_8_ < 0.0) {
    dVar4 = sqrt(auVar5._0_8_);
  }
  else {
    auVar5 = vsqrtsd_avx(auVar5,auVar5);
    dVar4 = auVar5._0_8_;
  }
  return (float)dVar4;
}

Assistant:

real Matrix::l2NormRow(int64_t i) const {
  auto norm = 0.0;
  for (auto j = 0; j < n_; j++) {
    norm += at(i, j) * at(i, j);
  }
  if (std::isnan(norm)) {
    throw std::runtime_error("Encountered NaN.");
  }
  return std::sqrt(norm);
}